

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O1

FillBoxId * __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
          (FillBoxId *__return_storage_ptr__,FabArrayCopyDescriptor<amrex::FArrayBox> *this,
          FabArrayId fabarrayid,Box *destFabBox,BoxList *returnedUnfilledBoxes,int fabarrayindex,
          int srccomp,int destcomp,int numcomp,bool bUseValidBox)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  BoxList *__x;
  BoxDomain unfilledBoxDomain;
  
  BoxDomain::BoxDomain(&unfilledBoxDomain,(IndexType)(destFabBox->btype).itype);
  if (returnedUnfilledBoxes != (BoxList *)0x0) {
    BoxDomain::add(&unfilledBoxDomain,destFabBox);
  }
  AddBoxDoIt(this,fabarrayid,destFabBox,returnedUnfilledBoxes,fabarrayindex,srccomp,destcomp,numcomp
             ,bUseValidBox,&unfilledBoxDomain);
  if (returnedUnfilledBoxes != (BoxList *)0x0) {
    BoxList::clear(returnedUnfilledBoxes);
    __x = BoxDomain::boxList(&unfilledBoxDomain);
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::operator=
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)returnedUnfilledBoxes,
               (vector<amrex::Box,_std::allocator<amrex::Box>_> *)__x);
    (returnedUnfilledBoxes->btype).itype = (__x->btype).itype;
  }
  iVar1 = this->nextFillBoxId;
  this->nextFillBoxId = iVar1 + 1;
  uVar2 = *(undefined8 *)(destFabBox->smallend).vect;
  uVar3 = *(undefined8 *)((destFabBox->smallend).vect + 2);
  uVar4 = *(undefined8 *)((destFabBox->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->m_fillBox).bigend.vect =
       *(undefined8 *)(destFabBox->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->m_fillBox).bigend.vect + 2) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->m_fillBox).smallend.vect = uVar2;
  *(undefined8 *)((__return_storage_ptr__->m_fillBox).smallend.vect + 2) = uVar3;
  __return_storage_ptr__->m_fillBoxId = iVar1;
  __return_storage_ptr__->m_fabIndex = -1;
  if (unfilledBoxDomain.super_BoxList.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(unfilledBoxDomain.super_BoxList.m_lbox.
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)unfilledBoxDomain.super_BoxList.m_lbox.
                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)unfilledBoxDomain.super_BoxList.m_lbox.
                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

FillBoxId
FabArrayCopyDescriptor<FAB>::AddBox (FabArrayId fabarrayid,
                                     const Box& destFabBox,
                                     BoxList*   returnedUnfilledBoxes,
                                     int        fabarrayindex,
                                     int        srccomp,
                                     int        destcomp,
                                     int        numcomp,
                                     bool       bUseValidBox)
{
    BoxDomain unfilledBoxDomain(destFabBox.ixType());

    if (returnedUnfilledBoxes != 0)
    {
        unfilledBoxDomain.add(destFabBox);
    }

    AddBoxDoIt(fabarrayid,
               destFabBox,
               returnedUnfilledBoxes,
               fabarrayindex,
               srccomp,
               destcomp,
               numcomp,
               bUseValidBox,
               unfilledBoxDomain);

    if (returnedUnfilledBoxes != 0)
    {
        returnedUnfilledBoxes->clear();
        (*returnedUnfilledBoxes) = unfilledBoxDomain.boxList();
    }

    return FillBoxId(nextFillBoxId++, destFabBox);
}